

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

arg_hashtable_t * arg_hashtable_create(uint minsize,_func_uint_void_ptr *hashfn,arg_comparefn *eqfn)

{
  size_t __size;
  uint *puVar1;
  arg_hashtable_t *paVar2;
  arg_hashtable_entry **__s;
  uint uVar3;
  long lVar4;
  double dVar5;
  
  if (minsize < 0x40000001) {
    puVar1 = primes;
    lVar4 = 0;
    do {
      uVar3 = *puVar1;
      if (minsize < uVar3) goto LAB_00120c9b;
      lVar4 = lVar4 + 1;
      puVar1 = puVar1 + 1;
    } while (lVar4 != 0x1a);
    uVar3 = 0x35;
    lVar4 = 0x1a;
LAB_00120c9b:
    paVar2 = (arg_hashtable_t *)malloc(0x30);
    if (paVar2 == (arg_hashtable_t *)0x0) {
      (*s_panic)("Out of memory!\n");
    }
    __size = (ulong)uVar3 * 8;
    __s = (arg_hashtable_entry **)malloc(__size);
    if (__s == (arg_hashtable_entry **)0x0) {
      (*s_panic)("Out of memory!\n");
    }
    paVar2->table = __s;
    memset(__s,0,__size);
    paVar2->tablelength = uVar3;
    paVar2->primeindex = (uint)lVar4;
    paVar2->entrycount = 0;
    paVar2->hashfn = hashfn;
    paVar2->eqfn = eqfn;
    dVar5 = ceil((double)uVar3 * 0.6499999761581421);
    paVar2->loadlimit = (uint)(long)dVar5;
  }
  else {
    paVar2 = (arg_hashtable_t *)0x0;
  }
  return paVar2;
}

Assistant:

arg_hashtable_t* arg_hashtable_create(unsigned int minsize, unsigned int (*hashfn)(const void*), int (*eqfn)(const void*, const void*)) {
    arg_hashtable_t* h;
    unsigned int pindex;
    unsigned int size = primes[0];

    /* Check requested hash table isn't too large */
    if (minsize > (1u << 30))
        return NULL;

    /*
     * Enforce size as prime. The reason is to avoid clustering of values
     * into a small number of buckets (yes, distribution). A more even
     *  distributed hash table will perform more consistently.
     */
    for (pindex = 0; pindex < prime_table_length; pindex++) {
        if (primes[pindex] > minsize) {
            size = primes[pindex];
            break;
        }
    }

    h = (arg_hashtable_t*)xmalloc(sizeof(arg_hashtable_t));
    h->table = (struct arg_hashtable_entry**)xmalloc(sizeof(struct arg_hashtable_entry*) * size);
    memset(h->table, 0, size * sizeof(struct arg_hashtable_entry*));
    h->tablelength = size;
    h->primeindex = pindex;
    h->entrycount = 0;
    h->hashfn = hashfn;
    h->eqfn = eqfn;
    h->loadlimit = (unsigned int)ceil(size * (double)max_load_factor);
    return h;
}